

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManComputeBackward3(Of_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  bool bVar6;
  int FaninId;
  int Required;
  int Cost;
  int CostMin;
  int AreaAft;
  int AreaBef;
  int *pCutMin;
  int *pCut;
  int *pList;
  int iVar;
  int k;
  int i;
  int DelayLut1;
  Gia_Obj_t *pObj;
  Of_Man_t *p_local;
  
  iVar1 = p->pPars->nDelayLut1;
  Of_ManComputeOutputRequired(p,0);
  p->pPars->Edge = 0;
  p->pPars->Area = 0;
  iVar = p->pGia->nObjs;
  while( true ) {
    do {
      while( true ) {
        do {
          iVar = iVar + -1;
          bVar6 = false;
          if (0 < iVar) {
            _i = Gia_ManObj(p->pGia,iVar);
            bVar6 = _i != (Gia_Obj_t *)0x0;
          }
          if (!bVar6) {
            return;
          }
          iVar2 = Gia_ObjIsAnd(_i);
        } while (iVar2 == 0);
        iVar2 = Of_ObjRequired(p,iVar);
        iVar3 = Gia_ObjIsBuf(_i);
        if (iVar3 == 0) break;
        iVar3 = Gia_ObjFaninId0(_i,iVar);
        Of_ObjUpdateRequired(p,iVar3,iVar2);
      }
      iVar3 = Of_ObjRefNum(p,iVar);
    } while (iVar3 == 0);
    piVar5 = Of_ObjCutBestP(p,iVar);
    iVar3 = Of_CutDeref_rec(p,piVar5);
    _AreaAft = (int *)0x0;
    Required = 1000000000;
    piVar5 = Of_ObjCutSet(p,iVar);
    pList._4_4_ = 0;
    pCutMin = piVar5 + 1;
    while (pList._4_4_ < *piVar5) {
      iVar4 = Of_CutDelay1(pCutMin);
      if ((iVar4 <= iVar2) && (iVar4 = Of_CutAreaDerefed2(p,pCutMin), iVar4 < Required)) {
        _AreaAft = pCutMin;
        Required = iVar4;
      }
      pList._4_4_ = pList._4_4_ + 1;
      iVar4 = Of_CutSize(pCutMin);
      pCutMin = pCutMin + (iVar4 + 4);
    }
    if (_AreaAft == (int *)0x0) break;
    Of_ObjSetCutBestP(p,piVar5,iVar,_AreaAft);
    pList._4_4_ = 0;
    while( true ) {
      iVar4 = Of_CutSize(_AreaAft);
      bVar6 = false;
      if (pList._4_4_ < iVar4) {
        pList._0_4_ = Of_CutVar(_AreaAft,pList._4_4_);
        bVar6 = (int)pList != 0;
      }
      if (!bVar6) break;
      Of_ObjUpdateRequired(p,(int)pList,iVar2 - iVar1);
      pList._4_4_ = pList._4_4_ + 1;
    }
    iVar2 = Of_CutRef_rec(p,_AreaAft);
    if (iVar3 < iVar2) {
      __assert_fail("AreaAft <= AreaBef",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                    ,0x506,"void Of_ManComputeBackward3(Of_Man_t *)");
    }
    iVar2 = Of_CutSize(_AreaAft);
    p->pPars->Edge = (long)iVar2 + p->pPars->Edge;
    p->pPars->Area = p->pPars->Area + 1;
  }
  __assert_fail("pCutMin != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                ,0x500,"void Of_ManComputeBackward3(Of_Man_t *)");
}

Assistant:

void Of_ManComputeBackward3( Of_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int i, k, iVar, * pList, * pCut, * pCutMin;
    int AreaBef = 0, AreaAft = 0;
    Of_ManComputeOutputRequired( p, 0 );
    // compute area and edges
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        int CostMin, Cost, Required = Of_ObjRequired(p, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            int FaninId = Gia_ObjFaninId0(pObj, i);
            Of_ObjUpdateRequired( p, FaninId, Required );
            continue;
        }
        if ( !Of_ObjRefNum(p, i) )
            continue;
        // deref best cut
        AreaBef = Of_CutDeref_rec( p, Of_ObjCutBestP(p, i) );        
        // select the best cut
        pCutMin = NULL;
        CostMin = ABC_INFINITY;
        pList = Of_ObjCutSet( p, i );
        Of_SetForEachCut( pList, pCut, k )
        {
            if ( Of_CutDelay1(pCut) > Required )
                continue;
            Cost = Of_CutAreaDerefed2( p, pCut );
            if ( CostMin > Cost )
            {
                CostMin = Cost;
                pCutMin = pCut;
            }
        }
        // the cut is selected
        assert( pCutMin != NULL );
        Of_ObjSetCutBestP( p, pList, i, pCutMin );
        Of_CutForEachVar( pCutMin, iVar, k )
            Of_ObjUpdateRequired( p, iVar, Required - DelayLut1 );
        // ref best cut
        AreaAft = Of_CutRef_rec( p, pCutMin );
        assert( AreaAft <= AreaBef );
        // update parameters
        p->pPars->Edge += Of_CutSize(pCutMin);
        p->pPars->Area++;
    }
}